

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O1

void __thiscall
duckdb::RadixPartitionedHashTable::Sink
          (RadixPartitionedHashTable *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input,DataChunk *payload_input,unsafe_vector<idx_t> *filter)

{
  unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
  *this_00;
  RadixHTGlobalSinkState *gstate;
  RadixHTLocalSinkState *lstate;
  idx_t iVar1;
  _Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false> _Var2;
  _Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false> _Var3;
  pointer pGVar4;
  type this_01;
  ulong uVar5;
  double dVar6;
  _Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false> local_38;
  
  gstate = (RadixHTGlobalSinkState *)input->global_state;
  lstate = (RadixHTLocalSinkState *)input->local_state;
  this_00 = &lstate->ht;
  if ((lstate->ht).
      super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
      .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl ==
      (GroupedAggregateHashTable *)0x0) {
    iVar1 = (gstate->config).sink_capacity;
    lstate->local_sink_capacity = iVar1;
    CreateHT((RadixPartitionedHashTable *)&stack0xffffffffffffffc8,(ClientContext *)this,
             (idx_t)context->client,iVar1);
    _Var3._M_head_impl = local_38._M_head_impl;
    local_38._M_head_impl = (GroupedAggregateHashTable *)0x0;
    _Var2._M_head_impl =
         (lstate->ht).
         super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
         .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl;
    (lstate->ht).
    super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
    .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl =
         _Var3._M_head_impl;
    if (_Var2._M_head_impl != (GroupedAggregateHashTable *)0x0) {
      (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseAggregateHashTable + 8))();
    }
    if (gstate->number_of_threads < 3) {
      lstate->adapted = true;
    }
    else {
      pGVar4 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
               ::operator->(this_00);
      pGVar4->enable_hll = true;
    }
    LOCK();
    (gstate->active_threads).super___atomic_base<unsigned_long>._M_i =
         (gstate->active_threads).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  PopulateGroupChunk(this,&lstate->group_chunk,chunk);
  this_01 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
            ::operator*(this_00);
  GroupedAggregateHashTable::AddChunk(this_01,&lstate->group_chunk,payload_input,filter);
  if (lstate->adapted == false) {
    pGVar4 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
             ::operator->(this_00);
    if (0xfffff < pGVar4->sink_count) {
      DecideAdaptation(gstate,lstate);
      this_01->enable_hll = false;
      lstate->adapted = true;
    }
  }
  dVar6 = (((double)CONCAT44(0x45300000,(int)(lstate->local_sink_capacity >> 0x20)) -
           1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lstate->local_sink_capacity) - 4503599627370496.0)) /
          1.25;
  uVar5 = (ulong)dVar6;
  if (((long)(dVar6 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5) <=
      this_01->count + 0x800) {
    if ((2 < gstate->number_of_threads) || (((gstate->external)._M_base._M_i & 1U) != 0)) {
      GroupedAggregateHashTable::Abandon(this_01);
    }
    iVar1 = this_01->radix_bits;
    MaybeRepartition(context->client,gstate,lstate);
    if ((iVar1 != this_01->radix_bits) && (this_01->count != 0)) {
      GroupedAggregateHashTable::Abandon(this_01);
      if (((gstate->external)._M_base._M_i & 1U) != 0) {
        GroupedAggregateHashTable::Resize(this_01,lstate->local_sink_capacity);
        return;
      }
    }
  }
  return;
}

Assistant:

void RadixPartitionedHashTable::Sink(ExecutionContext &context, DataChunk &chunk, OperatorSinkInput &input,
                                     DataChunk &payload_input, const unsafe_vector<idx_t> &filter) const {
	auto &gstate = input.global_state.Cast<RadixHTGlobalSinkState>();
	auto &lstate = input.local_state.Cast<RadixHTLocalSinkState>();
	if (!lstate.ht) {
		lstate.local_sink_capacity = gstate.config.sink_capacity;
		lstate.ht = CreateHT(context.client, lstate.local_sink_capacity, gstate.config.GetRadixBits());
		if (gstate.number_of_threads > RadixHTConfig::GROW_STRATEGY_THREAD_THRESHOLD) {
			// Not using grow strategy, so we enable the HLL to potentially adapt later
			lstate.ht->EnableHLL(true);
		} else {
			// Using grow strategy, so won't ever adapt
			lstate.adapted = true;
		}
		gstate.active_threads++;
	}

	auto &group_chunk = lstate.group_chunk;
	PopulateGroupChunk(group_chunk, chunk);

	auto &ht = *lstate.ht;
	ht.AddChunk(group_chunk, payload_input, filter);

	// Decide whether we should adapt our strategy to the data
	if (!lstate.adapted && lstate.ht->GetSinkCount() >= RadixHTLocalSinkState::ADAPTIVITY_THRESHOLD) {
		DecideAdaptation(gstate, lstate);
		ht.EnableHLL(false); // Can be disabled now (costs 5-10% performance in worst case, single column distinct)
		lstate.adapted = true;
	}

	if (ht.Count() + STANDARD_VECTOR_SIZE < GroupedAggregateHashTable::ResizeThreshold(lstate.local_sink_capacity)) {
		return; // We can fit another chunk
	}

	if (gstate.number_of_threads > RadixHTConfig::GROW_STRATEGY_THREAD_THRESHOLD || gstate.external) {
		// 'Reset' the HT without taking its data, we can just keep appending to the same collection
		// This only works because we never resize the HT
		// We don't do this when running with 1 or 2 threads, it only makes sense when there's many threads
		ht.Abandon();
	}

	// Check if we need to repartition
	const auto radix_bits_before = ht.GetRadixBits();
	MaybeRepartition(context.client, gstate, lstate);
	const auto repartitioned = radix_bits_before != ht.GetRadixBits();

	if (repartitioned && ht.Count() != 0) {
		// We repartitioned, but we didn't clear the pointer table / reset the count because we're on 1 or 2 threads
		ht.Abandon();
		if (gstate.external) {
			ht.Resize(lstate.local_sink_capacity);
		}
	}

	// TODO: combine early and often
}